

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall el::base::LogDispatcher::dispatch(LogDispatcher *this)

{
  TypedConfigurations *this_00;
  bool bVar1;
  Level level;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  Logger *pLVar4;
  PreRollOutCallback *PreRollOutCallback;
  reference __p;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
  local_98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
  *local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
  *h;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
  *__range2;
  LogDispatchData data;
  LogDispatchCallback *callback;
  TypedConfigurations *tc;
  ScopedLock scopedLock;
  LogDispatcher *this_local;
  
  if (((this->m_proceed & 1U) != 0) && (this->m_dispatchAction == None)) {
    this->m_proceed = false;
  }
  if ((this->m_proceed & 1U) != 0) {
    scopedLock._vptr_NoScopedLock = (_func_int **)this;
    peVar3 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)elStorage);
    iVar2 = (*(peVar3->super_ThreadSafe)._vptr_ThreadSafe[2])();
    threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::NoScopedLock
              ((NoScopedLock<el::base::threading::internal::NoMutex> *)&tc,
               (NoMutex *)CONCAT44(extraout_var,iVar2));
    pLVar4 = LogMessage::logger(&this->m_logMessage);
    this_00 = pLVar4->m_typedConfigurations;
    peVar3 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)elStorage);
    bVar1 = Storage::hasFlag(peVar3,StrictLogFileSizeCheck);
    if (bVar1) {
      level = LogMessage::level(&this->m_logMessage);
      peVar3 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)elStorage);
      PreRollOutCallback = Storage::preRollOutCallback(peVar3);
      TypedConfigurations::validateFileRolling(this_00,level,PreRollOutCallback);
    }
    data.m_dispatchAction = 0;
    data._10_6_ = 0;
    LogDispatchData::LogDispatchData((LogDispatchData *)&__range2);
    peVar3 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)elStorage);
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
             ::begin(&peVar3->m_logDispatchCallbacks);
    h = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
           ::end(&peVar3->m_logDispatchCallbacks);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&h), bVar1) {
      __p = std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>
            ::operator*(&__end2);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
      ::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_true>
                (&local_98,__p);
      local_68 = &local_98;
      data._8_8_ = std::__shared_ptr<el::LogDispatchCallback,_(__gnu_cxx::_Lock_policy)2>::get
                             (&local_98.second.
                               super___shared_ptr<el::LogDispatchCallback,_(__gnu_cxx::_Lock_policy)2>
                             );
      if (((element_type *)data._8_8_ != (element_type *)0x0) &&
         (bVar1 = Callback<el::LogDispatchData>::enabled
                            ((Callback<el::LogDispatchData> *)data._8_8_), bVar1)) {
        LogDispatchData::setLogMessage((LogDispatchData *)&__range2,&this->m_logMessage);
        LogDispatchData::setDispatchAction((LogDispatchData *)&__range2,this->m_dispatchAction);
        (*(code *)**(undefined8 **)data._8_8_)();
        (**(code **)(*(long *)data._8_8_ + 0x28))(data._8_8_,&__range2);
        (**(code **)(*(long *)data._8_8_ + 8))();
      }
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
      ::~pair(&local_98);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>
      ::operator++(&__end2);
    }
    threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::~NoScopedLock
              ((NoScopedLock<el::base::threading::internal::NoMutex> *)&tc);
  }
  return;
}

Assistant:

void dispatch(void) {
        if (m_proceed && m_dispatchAction == base::DispatchAction::None) {
            m_proceed = false;
        }
        if (!m_proceed) {
            return;
        }
        // We minimize the time of ELPP's lock - this lock is released after log is written
        base::threading::ScopedLock scopedLock(ELPP->lock());
        base::TypedConfigurations* tc = m_logMessage.logger()->m_typedConfigurations;
        if (ELPP->hasFlag(LoggingFlag::StrictLogFileSizeCheck)) {
            tc->validateFileRolling(m_logMessage.level(), ELPP->preRollOutCallback());
        }
        LogDispatchCallback* callback = nullptr;
        LogDispatchData data;
        for (const std::pair<std::string, base::type::LogDispatchCallbackPtr>& h 
                : ELPP->m_logDispatchCallbacks) {
            callback = h.second.get();
            if (callback != nullptr && callback->enabled()) {
                data.setLogMessage(&m_logMessage);
                data.setDispatchAction(m_dispatchAction);
                callback->acquireLock();
                callback->handle(&data);
                callback->releaseLock();
            }
        }
    }